

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCommandLineArguments.cxx
# Opt level: O2

int argument(char *arg,char *value,void *call_data)

{
  ostream *poVar1;
  char *pcVar2;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Got argument: \"");
  poVar1 = std::operator<<(poVar1,arg);
  poVar1 = std::operator<<(poVar1,"\" value: \"");
  pcVar2 = "(null)";
  if (value != (char *)0x0) {
    pcVar2 = value;
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1,"\"");
  std::endl<char,std::char_traits<char>>(poVar1);
  if (call_data != (void *)0x123) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"Problem processing call_data");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  return (uint)(call_data == (void *)0x123);
}

Assistant:

static int argument(const char* arg, const char* value, void* call_data)
{
  std::cout << "Got argument: \"" << arg << "\" value: \"" << (value?value:"(null)") << "\"" << std::endl;
  if ( call_data != random_ptr )
    {
    std::cerr << "Problem processing call_data" << std::endl;
    return 0;
    }
  return 1;
}